

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

void __thiscall ChainstateManager::ResetChainstates(ChainstateManager *this)

{
  long lVar1;
  long in_RDI;
  long in_FS_OFFSET;
  unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::unique_ptr<Chainstate,_std::default_delete<Chainstate>_>::reset
            (in_stack_ffffffffffffffd8,(pointer)0x14aef23);
  std::unique_ptr<Chainstate,_std::default_delete<Chainstate>_>::reset
            (in_stack_ffffffffffffffd8,(pointer)0x14aef36);
  *(undefined8 *)(in_RDI + 0x10) = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ChainstateManager::ResetChainstates()
{
    m_ibd_chainstate.reset();
    m_snapshot_chainstate.reset();
    m_active_chainstate = nullptr;
}